

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O0

int stlest_(double *y,int *n,int *len,int *ideg,double *xs,double *ys,int *nleft,int *nright,
           double *w,int *userw,double *rw,int *ok)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double range;
  double h9;
  double h1;
  double r__;
  double dStack_70;
  int j;
  double h__;
  double c__;
  double b;
  double a;
  double d__2;
  double d__1;
  int i__1;
  double *ys_local;
  double *xs_local;
  int *ideg_local;
  int *len_local;
  int *n_local;
  double *y_local;
  
  iVar1 = *n;
  dStack_70 = pmax(*xs - (double)*nleft,(double)*nright - *xs);
  if (*n < *len) {
    dStack_70 = (double)((*len - *n) / 2) + dStack_70;
  }
  b = 0.0;
  iVar2 = *nright;
  for (r__._4_4_ = *nleft; r__._4_4_ <= iVar2; r__._4_4_ = r__._4_4_ + 1) {
    dVar3 = ABS((double)r__._4_4_ - *xs);
    if (dStack_70 * 0.999 < dVar3) {
      w[(long)r__._4_4_ + -1] = 0.0;
    }
    else {
      if (dStack_70 * 0.001 < dVar3) {
        dVar3 = dVar3 / dStack_70;
        dVar3 = -dVar3 * dVar3 * dVar3 + 1.0;
        w[(long)r__._4_4_ + -1] = dVar3 * dVar3 * dVar3;
      }
      else {
        w[(long)r__._4_4_ + -1] = 1.0;
      }
      if (*userw != 0) {
        w[(long)r__._4_4_ + -1] = rw[(long)r__._4_4_ + -1] * w[(long)r__._4_4_ + -1];
      }
      b = w[(long)r__._4_4_ + -1] + b;
    }
  }
  if (0.0 < b) {
    *ok = 1;
    iVar2 = *nright;
    for (r__._4_4_ = *nleft; r__._4_4_ <= iVar2; r__._4_4_ = r__._4_4_ + 1) {
      w[(long)r__._4_4_ + -1] = w[(long)r__._4_4_ + -1] / b;
    }
    if ((0.0 < dStack_70) && (0 < *ideg)) {
      b = 0.0;
      for (r__._4_4_ = *nleft; r__._4_4_ <= *nright; r__._4_4_ = r__._4_4_ + 1) {
        b = w[(long)r__._4_4_ + -1] * (double)r__._4_4_ + b;
      }
      dVar3 = *xs;
      h__ = 0.0;
      for (r__._4_4_ = *nleft; r__._4_4_ <= *nright; r__._4_4_ = r__._4_4_ + 1) {
        h__ = w[(long)r__._4_4_ + -1] * ((double)r__._4_4_ - b) * ((double)r__._4_4_ - b) + h__;
      }
      dVar4 = sqrt(h__);
      if (((double)iVar1 - 1.0) * 0.001 < dVar4) {
        iVar1 = *nright;
        for (r__._4_4_ = *nleft; r__._4_4_ <= iVar1; r__._4_4_ = r__._4_4_ + 1) {
          w[(long)r__._4_4_ + -1] =
               (((dVar3 - b) / h__) * ((double)r__._4_4_ - b) + 1.0) * w[(long)r__._4_4_ + -1];
        }
      }
    }
    *ys = 0.0;
    iVar1 = *nright;
    for (r__._4_4_ = *nleft; r__._4_4_ <= iVar1; r__._4_4_ = r__._4_4_ + 1) {
      *ys = w[(long)r__._4_4_ + -1] * y[(long)r__._4_4_ + -1] + *ys;
    }
  }
  else {
    *ok = 0;
  }
  return 0;
}

Assistant:

int stlest_(double *y, int *n, int *len, int *ideg, double *xs, double *ys, int *nleft, int *
	nright, double *w, int *userw, double *rw, int *ok)
{
    /* System generated locals */
    int i__1;
    double d__1, d__2;


    /* Local variables */
    double a, b, c__, h__;
    int j;
    double r__, h1, h9, range;

/* Arg */
/* Var */
    /* Parameter adjustments */
    --rw;
    --w;
    --y;

    /* Function Body */
    range = (double) (*n) - 1.;
/* Computing MAX */
    d__1 = *xs - (double) (*nleft), d__2 = (double) (*nright) - *xs;
    h__ = pmax(d__1,d__2);
    if (*len > *n) {
	h__ += (double) ((*len - *n) / 2);
    }
    h9 = h__ * .999;
    h1 = h__ * .001;
    a = 0.0;
    i__1 = *nright;
    for (j = *nleft; j <= i__1; ++j) {
	r__ = (d__1 = (double) j - *xs, fabs(d__1));
	if (r__ <= h9) {
	    if (r__ <= h1) {
		w[j] = 1.0;
	    } else {
/* Computing 3rd power */
		d__2 = r__ / h__;
/* Computing 3rd power */
		d__1 = 1.f - d__2 * (d__2 * d__2);
		w[j] = d__1 * (d__1 * d__1);
	    }
	    if (*userw) {
		w[j] = rw[j] * w[j];
	    }
	    a += w[j];
	} else {
	    w[j] = 0.0;
	}
/* L60: */
    }
    if (a <= 0.0) {
	*ok = 0;
    } else {
	*ok = 1;
	i__1 = *nright;
	for (j = *nleft; j <= i__1; ++j) {
	    w[j] /= a;
/* L69: */
	}
	if (h__ > 0.f && *ideg > 0) {
	    a = 0.f;
	    i__1 = *nright;
	    for (j = *nleft; j <= i__1; ++j) {
		a += w[j] * (double) j;
/* L73: */
	    }
	    b = *xs - a;
	    c__ = 0.0;
	    i__1 = *nright;
	    for (j = *nleft; j <= i__1; ++j) {
/* Computing 2nd power */
		d__1 = (double) j - a;
		c__ += w[j] * (d__1 * d__1);
/* L75: */
	    }
	    if (sqrt(c__) > range * .001) {
		b /= c__;
		i__1 = *nright;
		for (j = *nleft; j <= i__1; ++j) {
		    w[j] *= b * ((double) j - a) + 1.0;
/* L79: */
		}
	    }
	}
	*ys = 0.0;
	i__1 = *nright;
	for (j = *nleft; j <= i__1; ++j) {
	    *ys += w[j] * y[j];
/* L81: */
	}
    }
    return 0;
}